

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ComputeModuleDefinitionInfo
          (cmGeneratorTarget *this,string *config,ModuleDefinitionInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer ppcVar2;
  pointer ppcVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_68;
  string local_48;
  
  GetModuleDefinitionSources(this,&info->Sources,config);
  this_00 = this->Makefile;
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS","");
  bVar5 = cmMakefile::IsOn(this_00,&local_68);
  if (bVar5) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"WINDOWS_EXPORT_ALL_SYMBOLS","");
    bVar6 = cmTarget::GetPropertyAsBool(this->Target,&local_48);
  }
  else {
    bVar6 = false;
  }
  info->WindowsExportAllSymbols = bVar6;
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (info->WindowsExportAllSymbols == false) {
    ppcVar2 = (info->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppcVar3 = (info->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    bVar5 = (ulong)((long)ppcVar3 - (long)ppcVar2) < 9;
    info->DefFileGenerated = !bVar5;
    if (bVar5) {
      if (ppcVar2 == ppcVar3) {
        return;
      }
      cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar2);
      std::__cxx11::string::_M_assign((string *)info);
      return;
    }
  }
  else {
    info->DefFileGenerated = true;
  }
  pcVar4 = (this->ObjectDirectory)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar4,pcVar4 + (this->ObjectDirectory)._M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::operator=((string *)info,(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeModuleDefinitionInfo(
  std::string const& config, ModuleDefinitionInfo& info) const
{
  this->GetModuleDefinitionSources(info.Sources, config);
  info.WindowsExportAllSymbols =
    this->Makefile->IsOn("CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS") &&
    this->GetPropertyAsBool("WINDOWS_EXPORT_ALL_SYMBOLS");
  info.DefFileGenerated =
    info.WindowsExportAllSymbols || info.Sources.size() > 1;
  if (info.DefFileGenerated) {
    info.DefFile = this->ObjectDirectory /* has slash */ + "exports.def";
  } else if (!info.Sources.empty()) {
    info.DefFile = info.Sources.front()->GetFullPath();
  }
}